

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall ON_SubDComponentPtr::ClearSavedSubdivisionPoints(ON_SubDComponentPtr *this)

{
  ulong uVar1;
  
  uVar1 = this->m_ptr;
  switch((uint)uVar1 & 6) {
  case 2:
    if ((ON_SubDVertex *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDVertex *)0x0) {
      ON_SubDVertex::ClearSavedSubdivisionPoints((ON_SubDVertex *)(uVar1 & 0xfffffffffffffff8));
      return;
    }
    break;
  case 4:
    if ((ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDEdge *)0x0) {
      ON_SubDEdge::ClearSavedSubdivisionPoints((ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8));
      return;
    }
    break;
  case 6:
    if ((ON_SubDFace *)(uVar1 & 0xfffffffffffffff8) != (ON_SubDFace *)0x0) {
      ON_SubDFace::ClearSavedSubdivisionPoints((ON_SubDFace *)(uVar1 & 0xfffffffffffffff8));
      return;
    }
  }
  return;
}

Assistant:

void ON_SubDComponentPtr::ClearSavedSubdivisionPoints() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = Vertex();
    if (nullptr != v)
      v->ClearSavedSubdivisionPoints();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = Edge();
    if (nullptr != e)
      e->ClearSavedSubdivisionPoints();
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = Face();
    if (nullptr != f)
      f->ClearSavedSubdivisionPoints();
  }
  break;
  }
}